

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlfparser.h
# Opt level: O2

void xlfparser::_infer_token_subtypes<char>
               (vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *tokens,
               Options<char> *options,char *formula,size_t size)

{
  byte bVar1;
  ulong uVar2;
  bool bVar3;
  ostream *poVar4;
  undefined8 uVar5;
  out_of_range *this;
  char cVar6;
  pointer pTVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_1f8;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> number_re;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> number_re_ss;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&number_re_ss);
  poVar4 = std::operator<<(local_1a8,"^\\d+(\\");
  cVar6 = '.';
  if ((options->decimal_separator).super__Optional_base<char,_true,_true>._M_payload.
      super__Optional_payload_base<char>._M_engaged != false) {
    cVar6 = (options->decimal_separator).super__Optional_base<char,_true,_true>._M_payload.
            super__Optional_payload_base<char>._M_payload._M_value;
  }
  poVar4 = std::operator<<(poVar4,cVar6);
  std::operator<<(poVar4,"\\d+)?(E[+-]\\d+)?$");
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
  basic_regex<std::char_traits<char>,std::allocator<char>>
            ((basic_regex<char,std::__cxx11::regex_traits<char>> *)&number_re,&bStack_1f8,0x11);
  std::__cxx11::string::~string((string *)&bStack_1f8);
  pTVar7 = (tokens->super__Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>)._M_impl
           .super__Vector_impl_data._M_start;
  do {
    if (pTVar7 == (tokens->super__Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>).
                  _M_impl.super__Vector_impl_data._M_finish) {
      Catch::clara::std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&number_re);
      std::__cxx11::stringstream::~stringstream((stringstream *)&number_re_ss);
      return;
    }
    uVar2 = pTVar7->m_start;
    if ((size <= uVar2) || (size <= pTVar7->m_end)) {
      this = (out_of_range *)__cxa_allocate_exception(0x10);
      std::out_of_range::out_of_range(this,"Token index out of range");
      __cxa_throw(this,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
    }
    if (pTVar7->m_type == Operand) {
      if (pTVar7->m_subtype == None) {
        bVar3 = std::regex_match<char_const*,char,std::__cxx11::regex_traits<char>>
                          (formula + uVar2,formula + pTVar7->m_end + 1,&number_re,0);
        if (bVar3) {
          pTVar7->m_subtype = Number;
        }
        else {
          pTVar7->m_subtype = Range;
        }
      }
    }
    else if (pTVar7->m_type == OperatorInfix) {
      bVar1 = formula[uVar2];
      if (bVar1 == 0x2b) {
LAB_0015d15d:
        if ((tokens->super__Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>).
            _M_impl.super__Vector_impl_data._M_start < pTVar7) {
          switch(pTVar7[-1].m_type) {
          case Function:
          case Subexpression:
            if (pTVar7[-1].m_subtype != Stop) goto switchD_0015d174_caseD_3;
          case Operand:
          case OperatorPostfix:
switchD_0015d174_caseD_1:
            pTVar7->m_subtype = Math;
            break;
          default:
            goto switchD_0015d174_caseD_3;
          }
          goto LAB_0015d1fa;
        }
switchD_0015d174_caseD_3:
        uVar5 = 0x800000007;
      }
      else {
        if (bVar1 != 0x40) {
          if (bVar1 == 0x2d) goto LAB_0015d15d;
          if (pTVar7->m_subtype == None) {
            if (bVar1 - 0x3c < 3) {
              pTVar7->m_subtype = Logical;
            }
            else {
              if (bVar1 != 0x26) goto switchD_0015d174_caseD_1;
              pTVar7->m_subtype = Concatenation;
            }
          }
          goto LAB_0015d1fa;
        }
        uVar5 = 0xa00000007;
      }
      pTVar7->m_type = (int)uVar5;
      pTVar7->m_subtype = (int)((ulong)uVar5 >> 0x20);
    }
LAB_0015d1fa:
    pTVar7 = pTVar7 + 1;
  } while( true );
}

Assistant:

inline void _infer_token_subtypes(std::vector<Token>& tokens,
                                      const Options<char_type>& options,
                                      const char_type* formula,
                                      size_t size)
    {
        std::basic_stringstream<char_type> number_re_ss;
        number_re_ss << R"(^\d+(\)" << options.decimal_separator.value_or(XLFP_CHAR('.')) << R"(\d+)?(E[+-]\d+)?$)";
        const std::basic_regex<char_type> number_re(number_re_ss.str(),
            std::regex_constants::ECMAScript |
            std::regex_constants::icase);

        for (auto iter = tokens.begin(); iter != tokens.end(); ++iter)
        {
            auto& token = *iter;

            if (token.start() >= size || token.end() >= size)
                throw std::out_of_range("Token index out of range");

            if (token.type() == Token::Type::OperatorInfix && (
                    formula[token.start()] == XLFP_CHAR('-') ||
                    formula[token.start()] == XLFP_CHAR('+')))
            {
                // If the previous token was function, expression, postfix operator or operand, this token
                // is an infix operator of subtype math.
                if (iter > tokens.begin())
                {
                    auto& previous = *(iter-1);
                    if ((previous.type() == Token::Type::Function && previous.subtype() == Token::Subtype::Stop) ||
                        (previous.type() == Token::Type::Subexpression && previous.subtype() == Token::Subtype::Stop) ||
                        (previous.type() == Token::Type::OperatorPostfix) ||
                        (previous.type() == Token::Type::Operand))
                    {
                        token.subtype(Token::Subtype::Math);
                        continue;
                    }
                }

                // Otherwise assume it's a prefix operator
                token.type(Token::Type::OperatorPrefix);
                token.subtype(Token::Subtype::Math);
                continue;
            }

            if (token.type() == Token::Type::OperatorInfix && formula[token.start()] == XLFP_CHAR('+'))
            {
                // If the previous token  was function, expression, postfix operator or operand, this token
                // is an infix operator of subtype math.
                if (iter > tokens.begin())
                {
                    auto& previous = *(iter-1);
                    if ((previous.type() == Token::Type::Function && previous.subtype() == Token::Subtype::Stop) ||
                        (previous.type() == Token::Type::Subexpression && previous.subtype() == Token::Subtype::Stop) ||
                        (previous.type() == Token::Type::OperatorPostfix) ||
                        (previous.type() == Token::Type::Operand))
                    {
                        token.subtype(Token::Subtype::Math);
                        continue;
                    }
                }

                // Otherwise assume it's a prefix operator
                token.type(Token::Type::OperatorPrefix);
                token.subtype(Token::Subtype::Math);
                continue;
            }

            if (token.type() == Token::Type::OperatorInfix && formula[token.start()] == XLFP_CHAR('@'))
            {
                // Implicit intersection operator is always a prefix operator
                token.type(Token::Type::OperatorPrefix);
                token.subtype(Token::Subtype::Intersection);
            }

            if (token.type() == Token::Type::OperatorInfix && token.subtype() == Token::Subtype::None)
            {
                if (formula[token.start()] == XLFP_CHAR('<') ||
                    formula[token.start()] == XLFP_CHAR('>') ||
                    formula[token.start()] == XLFP_CHAR('='))
                {
                    token.subtype(Token::Subtype::Logical);
                }
                else if (formula[token.start()] == XLFP_CHAR('&'))
                {
                    token.subtype(Token::Subtype::Concatenation);
                }
                else
                {
                    token.subtype(Token::Subtype::Math);
                }

                continue;
            }

            // Set the operand type to Number or Range
            if (token.type() == Token::Type::Operand && token.subtype() == Token::Subtype::None)
            {
                if (std::regex_match(&formula[token.start()], &formula[token.end()]+1, number_re))
                {
                    token.subtype(Token::Subtype::Number);
                }
                else
                {
                    token.subtype(Token::Subtype::Range);
                }
            }
        }
    }